

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GetErrorCase::iterate(GetErrorCase *this)

{
  ResultCollector *results;
  Context *pCVar1;
  DebugMessageTestContext context;
  DebugMessageTestContext local_60;
  
  pCVar1 = (this->super_BaseCase).super_ErrorCase.super_TestCase.m_context;
  results = &(this->super_BaseCase).m_results;
  DebugMessageTestContext::DebugMessageTestContext
            (&local_60,&this->super_BaseCase,pCVar1->m_renderCtx,pCVar1->m_contextInfo,
             ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log,results,true);
  TestFunctionWrapper::call(&this->m_errorFunc,&local_60);
  tcu::ResultCollector::setTestContextResult
            (results,(this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx);
  NegativeTestShared::NegativeTestContext::~NegativeTestContext(&local_60.super_NegativeTestContext)
  ;
  return STOP;
}

Assistant:

GetErrorCase::IterateResult GetErrorCase::iterate (void)
{
	tcu::TestLog&			log		= m_testCtx.getLog();
	DebugMessageTestContext	context	= DebugMessageTestContext(*this, m_context.getRenderContext(), m_context.getContextInfo(), log, m_results, true);

	m_errorFunc.call(context);

	m_results.setTestContextResult(m_testCtx);

	return STOP;
}